

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::Expression::convertAssignment
          (ASTContext *context,Type *type,Expression *expr,SourceLocation location,
          Expression **lhsExpr,bitmask<slang::ast::AssignFlags> *assignFlags)

{
  byte *pbVar1;
  Scope *pSVar2;
  Type *assignFlags_00;
  bool bVar3;
  bitwidth_t bVar4;
  Expression *pEVar5;
  SourceLocation SVar6;
  SourceLocation SVar7;
  Type *pTVar8;
  SourceLocation *pSVar9;
  Expression *args_2;
  OpenRangeExpression *pOVar10;
  Diagnostic *diag;
  Diagnostic *diag_00;
  SourceLocation SVar11;
  char *func;
  InstanceSymbolBase *instance;
  DiagCode code;
  OpenRangeExpression *ore;
  Expression *result;
  Expression *conn;
  SourceLocation local_60;
  SourceLocation local_58;
  Type *local_50;
  SourceLocation local_48;
  SourceLocation local_40;
  bitwidth_t local_34;
  
  SVar11 = location;
  instance = (InstanceSymbolBase *)lhsExpr;
  bVar3 = bad(expr);
  if (bVar3) {
    return expr;
  }
  pSVar2 = (context->scope).ptr;
  if (pSVar2 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
    goto LAB_0038efb3;
  }
  SVar6 = (SourceLocation)pSVar2->compilation;
  if (type->canonical == (Type *)0x0) {
    local_58 = (SourceLocation)expr;
    Type::resolveCanonical(type);
    expr = (Expression *)local_58;
  }
  if ((type->canonical->super_Symbol).kind == ErrorType) {
    pEVar5 = badExpr((Compilation *)SVar6,expr);
    return pEVar5;
  }
  pTVar8 = *(Type **)((long)expr + 8);
  local_60 = (SourceLocation)expr;
  local_58 = SVar6;
  local_50 = (Type *)assignFlags;
  if (pTVar8 != (Type *)0x0) {
    bVar3 = Type::isEquivalent(type,pTVar8);
    if (bVar3) {
      selfDetermined(context,(Expression **)&local_60);
      return (Expression *)local_60;
    }
    local_40 = location;
    SVar6 = (SourceLocation)ASTContext::getInstance(context);
    if ((SVar6 != (SourceLocation)0x0) && (*(size_t *)((long)SVar6 + 0x48) != 0)) {
      local_34 = Type::getBitWidth(type);
      bVar4 = Type::getBitWidth(pTVar8);
      if ((local_34 != bVar4) || (bVar3 = Type::isAssignmentCompatible(type,pTVar8), !bVar3)) {
        if (lhsExpr == (Expression **)0x0) {
          SVar7 = (SourceLocation)
                  tryConnectPortArray((Expression *)context,(ASTContext *)type,(Type *)expr,
                                      (Expression *)SVar6,instance);
          local_48 = SVar7;
          if (SVar7 != (SourceLocation)0x0) {
            selfDetermined(context,(Expression **)&local_48);
            pSVar9 = &local_48;
            goto LAB_0038ee2a;
          }
        }
        else {
          SVar7 = (SourceLocation)
                  tryConnectPortArray((Expression *)context,(ASTContext *)pTVar8,(Type *)*lhsExpr,
                                      (Expression *)SVar6,instance);
          local_48 = SVar7;
          if (SVar7 != (SourceLocation)0x0) {
            selfDetermined(context,(Expression **)&local_48);
            *lhsExpr = (Expression *)local_48;
            if (local_50 == (Type *)0x0) {
              assert::assertFailed
                        ("assignFlags",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                         ,0x111,
                         "static Expression &slang::ast::Expression::convertAssignment(const ASTContext &, const Type &, Expression &, SourceLocation, Expression **, bitmask<AssignFlags> *)"
                        );
            }
            pbVar1 = (byte *)((long)&(local_50->super_Symbol).kind + 1);
            *pbVar1 = *pbVar1 | 1;
            selfDetermined(context,(Expression **)&local_60);
            pSVar9 = &local_60;
LAB_0038ee2a:
            SVar6 = *pSVar9;
          }
        }
        SVar11 = SVar6;
        if (SVar7 != (SourceLocation)0x0) {
          return (Expression *)SVar6;
        }
      }
    }
    bVar3 = Type::isAssignmentCompatible(type,pTVar8);
    if (bVar3) {
      bVar3 = Type::isNumeric(type);
      if ((bVar3) && (bVar3 = Type::isNumeric(pTVar8), bVar3)) {
        if ((((context->flags).m_bits & 8) != 0) &&
           (bVar3 = anon_unknown.dwarf_11c1e60::checkEnumInitializer
                              (context,type,(Expression *)local_60), !bVar3)) {
LAB_0038ef37:
          pEVar5 = badExpr((Compilation *)local_58,expr);
          return pEVar5;
        }
        pTVar8 = binaryOperatorType((Compilation *)local_58,type,pTVar8,false,true);
        bVar3 = Type::isEquivalent(type,pTVar8);
        if (bVar3) {
          pTVar8 = type;
        }
        contextDetermined(context,(Expression **)&local_60,pTVar8,local_40);
        if (bVar3) {
          bVar3 = false;
          SVar11 = local_60;
        }
        else {
          bVar3 = true;
          if (((context->flags).m_bits & 8) != 0) {
            selfDetermined(context,(Expression **)&local_60);
            bVar3 = false;
            SVar11 = local_60;
          }
        }
        if (!bVar3) {
          return (Expression *)SVar11;
        }
      }
LAB_0038ed6e:
      pEVar5 = ConversionExpression::makeImplicit
                         (context,type,Implicit,(Expression *)local_60,local_40);
      return pEVar5;
    }
    bVar3 = isImplicitlyAssignableTo(expr,(Compilation *)local_58,type);
    SVar11 = local_40;
    assignFlags_00 = local_50;
    if (bVar3) goto LAB_0038ed6e;
    if (*(int *)expr != 0x1f) {
      if (*(int *)expr == 0x11) {
        bVar3 = Bitstream::canBeSource
                          (type,(StreamingConcatenationExpression *)expr,local_40,context);
        if (bVar3) {
          local_48._0_4_ = 2;
          local_60 = (SourceLocation)
                     BumpAllocator::
                     emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                               ((BumpAllocator *)local_58,type,(ConversionKind *)&local_48,
                                (Expression *)local_60,(SourceRange *)((long)local_60 + 0x20));
          selfDetermined(context,(Expression **)&local_60);
          return (Expression *)local_60;
        }
      }
      else {
        code.subsystem = Expressions;
        code.code = 0x1b;
        local_50 = pTVar8;
        if ((((context->flags).m_bits & 0x40000000) == 0) &&
           ((bVar3 = Type::isCastCompatible(type,pTVar8), bVar3 ||
            (bVar3 = Type::isBitstreamCastable(type,local_50), bVar3)))) {
          code.subsystem = Expressions;
          code.code = 0x70;
        }
        diag = ASTContext::addDiag(context,code,SVar11);
        diag_00 = ast::operator<<(diag,local_50);
        ast::operator<<(diag_00,type);
        if (lhsExpr != (Expression **)0x0) {
          Diagnostic::operator<<(diag,(*lhsExpr)->sourceRange);
        }
        Diagnostic::operator<<(diag,*(SourceRange *)((long)expr + 0x20));
      }
      goto LAB_0038ef37;
    }
    pEVar5 = convertAssignment(context,type,*(Expression **)((long)expr + 0x30),local_40,lhsExpr,
                               (bitmask<slang::ast::AssignFlags> *)local_50);
    args_2 = convertAssignment(context,type,*(Expression **)((long)expr + 0x38),SVar11,lhsExpr,
                               (bitmask<slang::ast::AssignFlags> *)assignFlags_00);
    if (*(Type **)((long)expr + 8) != (Type *)0x0) {
      pOVar10 = BumpAllocator::
                emplace<slang::ast::OpenRangeExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                          ((BumpAllocator *)local_58,*(Type **)((long)expr + 8),pEVar5,args_2,
                           (SourceRange *)((long)expr + 0x20));
      (pOVar10->super_Expression).syntax = *(ExpressionSyntax **)((long)expr + 0x18);
      return &pOVar10->super_Expression;
    }
  }
  func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
LAB_0038efb3:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& Expression::convertAssignment(const ASTContext& context, const Type& type,
                                          Expression& expr, SourceLocation location,
                                          Expression** lhsExpr, bitmask<AssignFlags>* assignFlags) {
    if (expr.bad())
        return expr;

    Compilation& comp = context.getCompilation();
    if (type.isError())
        return badExpr(comp, &expr);

    Expression* result = &expr;
    const Type* rt = expr.type;
    if (type.isEquivalent(*rt)) {
        selfDetermined(context, result);
        return *result;
    }

    // If this is a port connection to an array of instances, check if the provided
    // expression represents an array that should be sliced on a per-instance basis.
    auto instance = context.getInstance();
    if (instance && !instance->arrayPath.empty()) {
        // If the connection is already of the right size and simply differs in
        // terms of four-statedness or signedness, don't bother trying to slice
        // out the connection.
        if (type.getBitWidth() != rt->getBitWidth() || !type.isAssignmentCompatible(*rt)) {
            // If we have an lhsExpr here, this is an output (or inout) port being connected.
            // We need to pass the lhs in as the expression to be connected, since we can't
            // slice the port side. If lhsExpr is null, this is an input port and we should
            // slice the incoming expression as an rvalue.
            if (lhsExpr) {
                Expression* conn = tryConnectPortArray(context, *rt, **lhsExpr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    *lhsExpr = conn;

                    ASSERT(assignFlags);
                    if (assignFlags)
                        *assignFlags |= AssignFlags::SlicedPort;

                    selfDetermined(context, result);
                    return *result;
                }
            }
            else {
                Expression* conn = tryConnectPortArray(context, type, expr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    return *conn;
                }
            }
        }
    }

    if (!type.isAssignmentCompatible(*rt)) {
        if (expr.isImplicitlyAssignableTo(comp, type)) {
            return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit,
                                                      *result, location);
        }

        if (expr.kind == ExpressionKind::Streaming) {
            if (Bitstream::canBeSource(type, expr.as<StreamingConcatenationExpression>(), location,
                                       context)) {
                // Add an implicit bit-stream casting otherwise types are not assignment compatible.
                // The size rule is not identical to explicit bit-stream casting so a different
                // ConversionKind is used.
                result = comp.emplace<ConversionExpression>(type, ConversionKind::StreamingConcat,
                                                            *result, result->sourceRange);
                selfDetermined(context, result);
                return *result;
            }
            return badExpr(comp, &expr);
        }
        else if (expr.kind == ExpressionKind::OpenRange) {
            // Convert each side of the range and return that as a new range.
            auto& ore = expr.as<OpenRangeExpression>();
            auto& left = convertAssignment(context, type, ore.left(), location, lhsExpr,
                                           assignFlags);
            auto& right = convertAssignment(context, type, ore.right(), location, lhsExpr,
                                            assignFlags);

            result = comp.emplace<OpenRangeExpression>(*expr.type, left, right, expr.sourceRange);
            result->syntax = expr.syntax;
            return *result;
        }

        DiagCode code = diag::BadAssignment;
        if (!context.flags.has(ASTFlags::OutputArg) &&
            (type.isCastCompatible(*rt) || type.isBitstreamCastable(*rt))) {
            code = diag::NoImplicitConversion;
        }

        auto& diag = context.addDiag(code, location);
        diag << *rt << type;
        if (lhsExpr)
            diag << (*lhsExpr)->sourceRange;

        diag << expr.sourceRange;
        return badExpr(comp, &expr);
    }

    if (type.isNumeric() && rt->isNumeric()) {
        if (context.flags.has(ASTFlags::EnumInitializer) &&
            !checkEnumInitializer(context, type, *result)) {
            return badExpr(comp, &expr);
        }

        // The "signednessFromRt" flag is important here; only the width of the lhs is
        // propagated down to operands, not the sign flag. Once the expression is appropriately
        // sized, the makeImplicit call down below will convert the sign for us.
        rt = binaryOperatorType(comp, &type, rt, false, /* signednessFromRt */ true);
        bool expanding = type.isEquivalent(*rt);
        if (expanding)
            rt = &type;

        contextDetermined(context, result, *rt, location);
        if (expanding)
            return *result;

        // Do not convert (truncate) enum initializer so out of range value can be checked.
        if (context.flags.has(ASTFlags::EnumInitializer)) {
            selfDetermined(context, result);
            return *result;
        }
    }

    return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit, *result,
                                              location);
}